

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O2

void __thiscall
duckdb::SQLLogicTestLogger::InternalException
          (SQLLogicTestLogger *this,MaterializedQueryResult *result)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_50,"Query failed with internal exception!",&local_51);
  PrintErrorHeader(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  PrintLineSep();
  PrintSQL(this);
  std::__cxx11::string::string((string *)&local_30,"Actual result:",(allocator *)&local_50);
  PrintHeader(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  PrintLineSep();
  duckdb::QueryResult::Print();
  return;
}

Assistant:

void SQLLogicTestLogger::InternalException(MaterializedQueryResult &result) {
	PrintErrorHeader("Query failed with internal exception!");
	PrintLineSep();
	PrintSQL();
	PrintHeader("Actual result:");
	PrintLineSep();
	result.Print();
}